

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O2

_Bool ggml_gallocr_reserve_n
                (ggml_gallocr_t galloc,ggml_cgraph *graph,int *node_buffer_ids,int *leaf_buffer_ids)

{
  ggml_hash_set *hash_set;
  free_block *pfVar1;
  ggml_dyn_tallocr *pgVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  size_t sVar5;
  int iVar6;
  uint uVar7;
  hash_node *phVar8;
  size_t sVar9;
  long lVar10;
  node_alloc *pnVar11;
  leaf_alloc *plVar12;
  ggml_backend_buffer_t pgVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  size_t sVar17;
  ggml_backend_buffer_t *ppgVar18;
  char *pcVar19;
  uint uVar20;
  free_block *pfVar21;
  ggml_dyn_tallocr *pgVar22;
  ggml_tensor *view_src;
  ggml_tensor *t;
  free_block *pfVar23;
  int *piVar24;
  uint uVar25;
  long lVar26;
  free_block *pfVar27;
  int iVar28;
  int i_3;
  int i_2;
  int i;
  long lVar29;
  node_alloc *pnVar30;
  int j;
  long lVar31;
  bool bVar32;
  long local_88;
  ggml_hash_set local_48;
  
  uVar14 = (long)graph->n_leafs + (long)graph->n_nodes;
  uVar14 = (uVar14 >> 2) + uVar14;
  hash_set = &galloc->hash_set;
  if ((galloc->hash_set).size < uVar14) {
    ggml_hash_set_free(hash_set);
    ggml_hash_set_new(&local_48,uVar14);
    (galloc->hash_set).keys = local_48.keys;
    hash_set->size = local_48.size;
    (galloc->hash_set).used = local_48.used;
    if ((galloc->hash_set).keys == (ggml_tensor **)0x0) {
      pcVar19 = "galloc->hash_set.keys != NULL";
      iVar28 = 0x2aa;
      goto LAB_00129847;
    }
    free(galloc->hash_values);
    phVar8 = (hash_node *)malloc((galloc->hash_set).size << 5);
    galloc->hash_values = phVar8;
    if (phVar8 == (hash_node *)0x0) {
      pcVar19 = "galloc->hash_values != NULL";
      iVar28 = 0x2ae;
      goto LAB_00129847;
    }
  }
  uVar15 = 0;
  uVar14 = (ulong)(uint)galloc->n_buffers;
  if (galloc->n_buffers < 1) {
    uVar14 = uVar15;
  }
  for (; uVar14 != uVar15; uVar15 = uVar15 + 1) {
    pgVar2 = galloc->buf_tallocs[uVar15];
    pgVar2->n_free_blocks = 1;
    pgVar2->free_blocks[0].offset = 0;
    pgVar2->free_blocks[0].size = 0x7fffffffffffffff;
    pgVar2->max_size = 0;
  }
  ggml_hash_set_reset(hash_set);
  memset(galloc->hash_values,0,(galloc->hash_set).size << 5);
  for (lVar29 = 0; lVar29 < graph->n_leafs; lVar29 = lVar29 + 1) {
    if (leaf_buffer_ids == (int *)0x0) {
      iVar28 = 0;
    }
    else {
      iVar28 = leaf_buffer_ids[lVar29];
    }
    ggml_gallocr_allocate_node(galloc,graph->leafs[lVar29],iVar28);
  }
  for (lVar29 = 0; uVar14 = (ulong)graph->n_nodes, lVar29 < (long)uVar14; lVar29 = lVar29 + 1) {
    pgVar3 = graph->nodes[lVar29];
    if ((pgVar3->view_src != (ggml_tensor *)0x0) && (pgVar3->op != GGML_OP_NONE)) {
      phVar8 = ggml_gallocr_hash_get(galloc,pgVar3->view_src);
      phVar8->n_views = phVar8->n_views + 1;
    }
    if ((pgVar3->flags & 1) != 0) {
      if (node_buffer_ids == (int *)0x0) {
        iVar28 = 0;
      }
      else {
        iVar28 = node_buffer_ids[lVar29];
      }
      ggml_gallocr_allocate_node(galloc,graph->nodes[lVar29],iVar28);
    }
    for (lVar31 = 0; lVar31 != 10; lVar31 = lVar31 + 1) {
      pgVar4 = pgVar3->src[lVar31];
      if (pgVar4 != (ggml_tensor *)0x0) {
        phVar8 = ggml_gallocr_hash_get(galloc,pgVar4);
        phVar8->n_children = phVar8->n_children + 1;
        if ((pgVar4->flags & 1) != 0) {
          if (node_buffer_ids == (int *)0x0) {
            iVar28 = 0;
          }
          else {
            iVar28 = node_buffer_ids[lVar29];
          }
          ggml_gallocr_allocate_node(galloc,pgVar4,iVar28);
        }
      }
    }
  }
  for (lVar29 = 0; lVar29 < (int)uVar14; lVar29 = lVar29 + 1) {
    if (node_buffer_ids == (int *)0x0) {
      iVar28 = 0;
    }
    else {
      iVar28 = node_buffer_ids[lVar29];
    }
    pgVar3 = graph->nodes[lVar29];
    for (lVar31 = 0x13; lVar31 != 0x1d; lVar31 = lVar31 + 1) {
      if ((ggml_tensor *)pgVar3->ne[lVar31 + -2] != (ggml_tensor *)0x0) {
        ggml_gallocr_allocate_node(galloc,(ggml_tensor *)pgVar3->ne[lVar31 + -2],iVar28);
      }
    }
    ggml_gallocr_allocate_node(galloc,pgVar3,iVar28);
    for (lVar31 = 0; lVar31 != 10; lVar31 = lVar31 + 1) {
      pgVar4 = pgVar3->src[lVar31];
      if (pgVar4 != (ggml_tensor *)0x0) {
        phVar8 = ggml_gallocr_hash_get(galloc,pgVar4);
        phVar8->n_children = phVar8->n_children + -1;
        if ((phVar8->n_children == 0) && (phVar8->n_views == 0)) {
          t = pgVar4->view_src;
          if (t == (ggml_tensor *)0x0) {
            t = pgVar4;
            if (phVar8->allocated == true) goto LAB_00129318;
          }
          else {
            phVar8 = ggml_gallocr_hash_get(galloc,t);
            piVar24 = &phVar8->n_views;
            *piVar24 = *piVar24 + -1;
            if (((*piVar24 == 0) && (phVar8->n_children == 0)) && (phVar8->allocated != false)) {
LAB_00129318:
              if ((t->flags & 2) == 0) {
                phVar8 = ggml_gallocr_hash_get(galloc,t);
                uVar14 = phVar8->offset;
                pgVar2 = galloc->buf_tallocs[phVar8->buffer_id];
                sVar9 = ggml_backend_buft_get_alloc_size(galloc->bufts[phVar8->buffer_id],t);
                uVar15 = pgVar2->alignment;
                uVar25 = 0;
                sVar9 = (uVar15 - sVar9 % uVar15) % uVar15 + sVar9;
                uVar7 = pgVar2->n_free_blocks;
                lVar10 = (long)(int)uVar7;
                pfVar1 = pgVar2->free_blocks;
                uVar15 = 0;
                if (0 < (int)uVar7) {
                  uVar15 = (ulong)uVar7;
                }
                pfVar27 = pgVar2->free_blocks;
                pfVar21 = pgVar2->free_blocks + 2;
                iVar28 = 1;
                pfVar23 = pfVar1;
                for (lVar26 = 0; pfVar27 = pfVar27 + 1, -lVar26 != uVar15; lVar26 = lVar26 + -1) {
                  sVar5 = pfVar23->offset;
                  sVar17 = pfVar23->size;
                  uVar20 = (uint)lVar26;
                  if (sVar17 + sVar5 == uVar14) {
                    sVar17 = sVar17 + sVar9;
                    pfVar23->size = sVar17;
                    iVar6 = uVar7 - 1;
                    if ((iVar6 != -uVar20 && SBORROW4(iVar6,-uVar20) == (int)(iVar6 + uVar20) < 0)
                       && (sVar5 + sVar17 == pfVar23[1].offset)) {
                      pfVar23->size = sVar17 + pfVar23[1].size;
                      pgVar2->n_free_blocks = iVar6;
                      for (; iVar28 < iVar6; iVar28 = iVar28 + 1) {
                        sVar9 = pfVar21->size;
                        pfVar21[-1].offset = pfVar21->offset;
                        pfVar21[-1].size = sVar9;
                        pfVar21 = pfVar21 + 1;
                      }
                    }
                    goto LAB_00129528;
                  }
                  if (uVar14 + sVar9 == sVar5) {
                    pfVar23->offset = uVar14;
                    pfVar23->size = sVar17 + sVar9;
                    if (lVar26 != 0) {
                      uVar20 = ~uVar20;
                      sVar5 = pgVar2->free_blocks[uVar20].size;
                      if (pfVar1[uVar20].offset + sVar5 == uVar14) {
                        pfVar1[uVar20].size = sVar5 + sVar17 + sVar9;
                        uVar7 = uVar7 - 1;
                        pgVar2->n_free_blocks = uVar7;
                        if ((int)uVar7 < (int)uVar25) {
                          uVar7 = uVar25;
                        }
                        lVar26 = lVar26 + (ulong)uVar7;
                        while (bVar32 = lVar26 != 0, lVar26 = lVar26 + -1, bVar32) {
                          sVar9 = pfVar27->size;
                          pfVar27[-1].offset = pfVar27->offset;
                          pfVar27[-1].size = sVar9;
                          pfVar27 = pfVar27 + 1;
                        }
                      }
                    }
                    goto LAB_00129528;
                  }
                  pfVar23 = pfVar23 + 1;
                  uVar25 = uVar25 + 1;
                  pfVar21 = pfVar21 + 1;
                  iVar28 = iVar28 + 1;
                }
                if (0xff < (int)uVar7) {
                  pcVar19 = "alloc->n_free_blocks < MAX_FREE_BLOCKS && \"out of free blocks\"";
                  iVar28 = 0x117;
                  goto LAB_00129847;
                }
                pfVar21 = pfVar1;
                for (uVar16 = 0; uVar15 != uVar16; uVar16 = uVar16 + 1) {
                  if (uVar14 <= pfVar21->offset) {
                    uVar15 = uVar16 & 0xffffffff;
                    break;
                  }
                  pfVar21 = pfVar21 + 1;
                }
                lVar26 = (long)(int)uVar15;
                pgVar22 = (ggml_dyn_tallocr *)(pgVar2->free_blocks + lVar10);
                for (; lVar26 < lVar10; lVar10 = lVar10 + -1) {
                  sVar5 = *(size_t *)((long)(pgVar22 + 0xffffffffffffffff) + 0x1010);
                  pgVar22->alignment = *(size_t *)((long)(pgVar22 + 0xffffffffffffffff) + 0x1008);
                  *(size_t *)&pgVar22->n_free_blocks = sVar5;
                  pgVar22 = (ggml_dyn_tallocr *)((long)(pgVar22 + 0xffffffffffffffff) + 0x1008);
                }
                pfVar1[lVar26].offset = uVar14;
                pgVar2->free_blocks[lVar26].size = sVar9;
                pgVar2->n_free_blocks = pgVar2->n_free_blocks + 1;
LAB_00129528:
                phVar8->allocated = false;
              }
            }
          }
        }
      }
    }
    uVar14 = (ulong)(uint)graph->n_nodes;
  }
  if (galloc->n_nodes < (int)uVar14) {
    free(galloc->node_allocs);
    uVar14 = (ulong)(uint)graph->n_nodes;
    pnVar11 = (node_alloc *)calloc((long)graph->n_nodes,0x108);
    galloc->node_allocs = pnVar11;
    if (pnVar11 == (node_alloc *)0x0) {
      pcVar19 = "galloc->node_allocs != NULL";
      iVar28 = 0x2bd;
      goto LAB_00129847;
    }
  }
  galloc->n_nodes = (int)uVar14;
  local_88 = 0x18;
  for (lVar29 = 0; lVar29 < (int)uVar14; lVar29 = lVar29 + 1) {
    pgVar3 = graph->nodes[lVar29];
    pnVar11 = galloc->node_allocs;
    pnVar30 = pnVar11 + lVar29;
    if ((pgVar3->view_src == (ggml_tensor *)0x0) && (pgVar3->data == (void *)0x0)) {
      phVar8 = ggml_gallocr_hash_get(galloc,pgVar3);
      iVar28 = phVar8->buffer_id;
      (pnVar30->dst).buffer_id = iVar28;
      (pnVar30->dst).offset = phVar8->offset;
      sVar9 = ggml_backend_buft_get_alloc_size(galloc->bufts[iVar28],pgVar3);
    }
    else {
      (pnVar30->dst).buffer_id = -1;
      (pnVar30->dst).offset = 0xffffffffffffffff;
      sVar9 = 0;
    }
    (pnVar30->dst).size_max = sVar9;
    piVar24 = (int *)((long)&(((node_alloc *)(pnVar11->src + -1))->dst).buffer_id + local_88);
    for (lVar31 = 0; lVar31 != 10; lVar31 = lVar31 + 1) {
      pgVar4 = pgVar3->src[lVar31];
      if (((pgVar4 == (ggml_tensor *)0x0) || (pgVar4->view_src != (ggml_tensor *)0x0)) ||
         (pgVar4->data != (void *)0x0)) {
        *piVar24 = -1;
        piVar24[2] = -1;
        piVar24[3] = -1;
        sVar9 = 0;
      }
      else {
        phVar8 = ggml_gallocr_hash_get(galloc,pgVar4);
        iVar28 = phVar8->buffer_id;
        *piVar24 = iVar28;
        *(size_t *)(piVar24 + 2) = phVar8->offset;
        sVar9 = ggml_backend_buft_get_alloc_size(galloc->bufts[iVar28],pgVar4);
      }
      *(size_t *)(piVar24 + 4) = sVar9;
      piVar24 = piVar24 + 6;
    }
    uVar14 = (ulong)(uint)graph->n_nodes;
    local_88 = local_88 + 0x108;
  }
  iVar28 = graph->n_leafs;
  if (galloc->n_leafs < iVar28) {
    free(galloc->leaf_allocs);
    iVar28 = graph->n_leafs;
    plVar12 = (leaf_alloc *)calloc((long)iVar28,0x18);
    galloc->leaf_allocs = plVar12;
    if (plVar12 == (leaf_alloc *)0x0) {
      pcVar19 = "galloc->leaf_allocs != NULL";
      iVar28 = 0x2de;
LAB_00129847:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-alloc.c"
                 ,iVar28,"GGML_ASSERT(%s) failed",pcVar19);
    }
  }
  galloc->n_leafs = iVar28;
  lVar31 = 0;
  for (lVar29 = 0; lVar29 < iVar28; lVar29 = lVar29 + 1) {
    pgVar3 = graph->leafs[lVar29];
    phVar8 = ggml_gallocr_hash_get(galloc,pgVar3);
    if ((pgVar3->view_src == (ggml_tensor *)0x0) && (pgVar3->data == (void *)0x0)) {
      iVar28 = phVar8->buffer_id;
      plVar12 = galloc->leaf_allocs;
      *(int *)((long)&(plVar12->leaf).buffer_id + lVar31) = iVar28;
      *(size_t *)((long)&(plVar12->leaf).offset + lVar31) = phVar8->offset;
      sVar9 = ggml_backend_buft_get_alloc_size(galloc->bufts[iVar28],pgVar3);
      plVar12 = galloc->leaf_allocs;
    }
    else {
      plVar12 = galloc->leaf_allocs;
      *(undefined4 *)((long)&(plVar12->leaf).buffer_id + lVar31) = 0xffffffff;
      *(undefined8 *)((long)&(plVar12->leaf).offset + lVar31) = 0xffffffffffffffff;
      sVar9 = 0;
    }
    *(size_t *)((long)&(plVar12->leaf).size_max + lVar31) = sVar9;
    iVar28 = graph->n_leafs;
    lVar31 = lVar31 + 0x18;
  }
  lVar29 = 0;
  do {
    iVar28 = galloc->n_buffers;
    if (iVar28 <= lVar29) {
LAB_00129818:
      return iVar28 <= lVar29;
    }
    lVar31 = 0;
    do {
      lVar10 = lVar31;
      if (lVar29 == lVar10) goto LAB_0012977d;
      lVar31 = lVar10 + 1;
    } while (galloc->buf_tallocs[lVar10] != galloc->buf_tallocs[lVar29]);
    galloc->buffers[lVar29] = galloc->buffers[lVar10];
LAB_0012977d:
    ppgVar18 = galloc->buffers;
    if (ppgVar18[lVar29] == (ggml_backend_buffer_t)0x0) {
      uVar14 = 0;
    }
    else {
      uVar14 = ggml_backend_buffer_get_size(ppgVar18[lVar29]);
      ppgVar18 = galloc->buffers;
    }
    uVar15 = galloc->buf_tallocs[lVar29]->max_size;
    pgVar13 = ppgVar18[lVar29];
    if (uVar14 < uVar15) {
LAB_001297b6:
      ggml_backend_buffer_free(pgVar13);
      pgVar13 = ggml_backend_buft_alloc_buffer(galloc->bufts[lVar29],uVar15);
      galloc->buffers[lVar29] = pgVar13;
      if (galloc->buffers[lVar29] == (ggml_backend_buffer_t)0x0) {
        pcVar19 = ggml_backend_buft_name(galloc->bufts[lVar29]);
        ggml_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to allocate %s buffer of size %zu\n",
                          "ggml_gallocr_reserve_n",pcVar19,uVar15);
        goto LAB_00129818;
      }
      ggml_backend_buffer_set_usage(galloc->buffers[lVar29],GGML_BACKEND_BUFFER_USAGE_COMPUTE);
    }
    else if (pgVar13 == (ggml_backend_buffer_t)0x0) {
      pgVar13 = (ggml_backend_buffer_t)0x0;
      goto LAB_001297b6;
    }
    lVar29 = lVar29 + 1;
  } while( true );
}

Assistant:

bool ggml_gallocr_reserve_n(ggml_gallocr_t galloc, struct ggml_cgraph * graph, const int * node_buffer_ids, const int * leaf_buffer_ids) {
    size_t min_hash_size = graph->n_nodes + graph->n_leafs;
    // add 25% margin to avoid hash collisions
    min_hash_size += min_hash_size / 4;

    // initialize hash table
    if (galloc->hash_set.size < min_hash_size) {
        ggml_hash_set_free(&galloc->hash_set);
        galloc->hash_set = ggml_hash_set_new(min_hash_size);
        GGML_ASSERT(galloc->hash_set.keys != NULL);

        free(galloc->hash_values);
        galloc->hash_values = malloc(sizeof(struct hash_node) * galloc->hash_set.size);
        GGML_ASSERT(galloc->hash_values != NULL);
    }

    // reset allocators
    for (int i = 0; i < galloc->n_buffers; i++) {
        ggml_dyn_tallocr_reset(galloc->buf_tallocs[i]);
    }

    // allocate in hash table
    ggml_gallocr_alloc_graph_impl(galloc, graph, node_buffer_ids, leaf_buffer_ids);

    // set the node_allocs from the hash table
    if (galloc->n_nodes < graph->n_nodes) {
        free(galloc->node_allocs);
        galloc->node_allocs = calloc(graph->n_nodes, sizeof(struct node_alloc));
        GGML_ASSERT(galloc->node_allocs != NULL);
    }
    galloc->n_nodes = graph->n_nodes;
    for (int i = 0; i < graph->n_nodes; i++) {
        struct ggml_tensor * node = graph->nodes[i];
        struct node_alloc * node_alloc = &galloc->node_allocs[i];
        if (node->view_src || node->data) {
            node_alloc->dst.buffer_id = -1;
            node_alloc->dst.offset = SIZE_MAX;
            node_alloc->dst.size_max = 0;
        } else {
            struct hash_node * hn = ggml_gallocr_hash_get(galloc, node);
            node_alloc->dst.buffer_id = hn->buffer_id;
            node_alloc->dst.offset    = hn->offset;
            node_alloc->dst.size_max  = ggml_backend_buft_get_alloc_size(galloc->bufts[hn->buffer_id], node);
        }
        for (int j = 0; j < GGML_MAX_SRC; j++) {
            struct ggml_tensor * src = node->src[j];
            if (!src || src->view_src || src->data) {
                node_alloc->src[j].buffer_id = -1;
                node_alloc->src[j].offset = SIZE_MAX;
                node_alloc->src[j].size_max = 0;
            } else {
                struct hash_node * hn = ggml_gallocr_hash_get(galloc, src);
                node_alloc->src[j].buffer_id = hn->buffer_id;
                node_alloc->src[j].offset   = hn->offset;
                node_alloc->src[j].size_max = ggml_backend_buft_get_alloc_size(galloc->bufts[hn->buffer_id], src);
            }
        }
    }
    if (galloc->n_leafs < graph->n_leafs) {
        free(galloc->leaf_allocs);
        galloc->leaf_allocs = calloc(graph->n_leafs, sizeof(galloc->leaf_allocs[0]));
        GGML_ASSERT(galloc->leaf_allocs != NULL);
    }
    galloc->n_leafs = graph->n_leafs;
    for (int i = 0; i < graph->n_leafs; i++) {
        struct ggml_tensor * leaf = graph->leafs[i];
        struct hash_node * hn = ggml_gallocr_hash_get(galloc, leaf);
        if (leaf->view_src || leaf->data) {
            galloc->leaf_allocs[i].leaf.buffer_id = -1;
            galloc->leaf_allocs[i].leaf.offset = SIZE_MAX;
            galloc->leaf_allocs[i].leaf.size_max = 0;
        } else {
            galloc->leaf_allocs[i].leaf.buffer_id = hn->buffer_id;
            galloc->leaf_allocs[i].leaf.offset = hn->offset;
            galloc->leaf_allocs[i].leaf.size_max = ggml_backend_buft_get_alloc_size(galloc->bufts[hn->buffer_id], leaf);
        }
    }

    // reallocate buffers if needed
    for (int i = 0; i < galloc->n_buffers; i++) {
        // if the buffer type is used multiple times, we reuse the same buffer
        for (int j = 0; j < i; j++) {
            if (galloc->buf_tallocs[j] == galloc->buf_tallocs[i]) {
                galloc->buffers[i] = galloc->buffers[j];
                break;
            }
        }

        size_t cur_size = galloc->buffers[i] ? ggml_backend_buffer_get_size(galloc->buffers[i]) : 0;
        size_t new_size = ggml_dyn_tallocr_max_size(galloc->buf_tallocs[i]);

        // even if there are no tensors allocated in this buffer, we still need to allocate it to initialize views
        if (new_size > cur_size || galloc->buffers[i] == NULL) {
#ifndef NDEBUG
            GGML_LOG_DEBUG("%s: reallocating %s buffer from size %.02f MiB to %.02f MiB\n", __func__, ggml_backend_buft_name(galloc->bufts[i]), cur_size / 1024.0 / 1024.0, new_size / 1024.0 / 1024.0);
#endif

            ggml_backend_buffer_free(galloc->buffers[i]);
            galloc->buffers[i] = ggml_backend_buft_alloc_buffer(galloc->bufts[i], new_size);
            if (galloc->buffers[i] == NULL) {
                GGML_LOG_ERROR("%s: failed to allocate %s buffer of size %zu\n", __func__, ggml_backend_buft_name(galloc->bufts[i]), new_size);
                return false;
            }
            ggml_backend_buffer_set_usage(galloc->buffers[i], GGML_BACKEND_BUFFER_USAGE_COMPUTE);
        }
    }

    return true;
}